

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_binary(void)

{
  int iVar1;
  undefined8 uVar2;
  bson_subtype_t *pbVar3;
  uint8_t **ppuVar4;
  uint32_t *puVar5;
  char *pcVar6;
  uint8_t *binary;
  uint32_t len;
  bson_subtype_t subtype;
  _Bool r;
  bson_t b;
  bson_error_t error;
  undefined4 uVar7;
  uint8_t *local_398;
  uint local_38c;
  bson_subtype_t local_388;
  byte local_381;
  undefined1 local_380 [240];
  uint local_290;
  uint local_28c;
  char acStack_288 [640];
  
  local_381 = bson_init_from_json(local_380,
                                  "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}"
                                  ,0xffffffffffffffff,&local_290);
  local_381 = local_381 & 1;
  if (local_381 == 0) {
    fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x4aa,"test_bson_json_read_binary","r",acStack_288);
    fflush(_stderr);
    abort();
  }
  uVar2 = bson_bcone_magic();
  pbVar3 = bcon_ensure_subtype_ptr(&local_388);
  ppuVar4 = bcon_ensure_const_uint8_ptr_ptr(&local_398);
  puVar5 = bcon_ensure_uint32_ptr(&local_38c);
  bcon_extract(local_380,"b",uVar2,4,pbVar3,ppuVar4,puVar5,0);
  uVar7 = (undefined4)((ulong)puVar5 >> 0x20);
  if (local_388 != BSON_SUBTYPE_MD5) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_388,"==",5,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4ad),"test_bson_json_read_binary");
    abort();
  }
  if (local_38c != 3) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %u %s %u\n%s:%d  %s()\n",(ulong)local_38c,"==",3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4ae),"test_bson_json_read_binary");
    abort();
  }
  if (local_398 != (uint8_t *)"foo") {
    iVar1 = strcmp((char *)local_398,"foo");
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",local_398,"foo");
      abort();
    }
  }
  bson_destroy(local_380);
  local_381 = bson_init_from_json(local_380,
                                  "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                  ,0xffffffffffffffff,&local_290);
  local_381 = local_381 & 1;
  if (local_381 == 0) {
    fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x4b8,"test_bson_json_read_binary","r",acStack_288);
    fflush(_stderr);
    abort();
  }
  uVar2 = bson_bcone_magic();
  pbVar3 = bcon_ensure_subtype_ptr(&local_388);
  ppuVar4 = bcon_ensure_const_uint8_ptr_ptr(&local_398);
  puVar5 = bcon_ensure_uint32_ptr(&local_38c);
  bcon_extract(local_380,"b",uVar2,4,pbVar3,ppuVar4,puVar5,0);
  uVar7 = (undefined4)((ulong)puVar5 >> 0x20);
  if (local_388 != BSON_SUBTYPE_MD5) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_388,"==",5,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4ba),"test_bson_json_read_binary");
    abort();
  }
  if (local_38c != 3) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %u %s %u\n%s:%d  %s()\n",(ulong)local_38c,"==",3,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4bb),"test_bson_json_read_binary");
    abort();
  }
  if (local_398 != (uint8_t *)"foo") {
    iVar1 = strcmp((char *)local_398,"foo");
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",local_398,"foo");
      abort();
    }
  }
  bson_destroy(local_380);
  local_381 = bson_init_from_json(local_380,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                  0xffffffffffffffff,&local_290);
  local_381 = local_381 & 1;
  if (((local_381 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x4c3,"test_bson_json_read_binary","!r");
    abort();
  }
  if (local_290 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_290,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4c7),"test_bson_json_read_binary");
    abort();
  }
  if (local_28c != 2) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_28c,"==",2,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4c7),"test_bson_json_read_binary");
    abort();
  }
  pcVar6 = strstr(acStack_288,"Missing \"base64\" after \"subType\"");
  if (pcVar6 == (char *)0x0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_288,
            "Missing \"base64\" after \"subType\"");
    abort();
  }
  local_381 = bson_init_from_json(local_380,"{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}",
                                  0xffffffffffffffff,&local_290);
  local_381 = local_381 & 1;
  if (((local_381 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x4cc,"test_bson_json_read_binary","!r");
    abort();
  }
  if (local_290 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_290,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4d0),"test_bson_json_read_binary");
    abort();
  }
  if (local_28c != 2) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_28c,"==",2,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar7,0x4d0),"test_bson_json_read_binary");
    abort();
  }
  pcVar6 = strstr(acStack_288,"Missing \"subType\" after \"base64\"");
  if (pcVar6 == (char *)0x0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_288,
            "Missing \"subType\" after \"base64\"");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_json_read_binary (void)
{
   bson_error_t error;
   bson_t b;
   bool r;
   bson_subtype_t subtype;
   uint32_t len;
   const uint8_t *binary;

   r = bson_init_from_json (
      &b,
      "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
      -1,
      &error);
   ASSERT_OR_PRINT (r, error);

   BCON_EXTRACT (&b, "b", BCONE_BIN (subtype, binary, len));
   ASSERT_CMPINT ((int) subtype, ==, 5);
   ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
   ASSERT_CMPSTR ((const char *) binary, "foo");

   bson_destroy (&b);

   r = bson_init_from_json (
      &b,
      "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}",
      -1,
      &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "b", BCONE_BIN (subtype, binary, len));
   ASSERT_CMPINT ((int) subtype, ==, 5);
   ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
   ASSERT_CMPSTR ((const char *) binary, "foo");

   bson_destroy (&b);

   /* no base64 */
   r = bson_init_from_json (
      &b, "{\"b\": {\"$binary\": {\"subType\": \"5\"}}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"base64\" after \"subType\"");

   /* no subType */
   r = bson_init_from_json (
      &b, "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"subType\" after \"base64\"");
}